

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

int __thiscall
QProxyStyle::styleHint
          (QProxyStyle *this,StyleHint hint,QStyleOption *option,QWidget *widget,
          QStyleHintReturn *returnData)

{
  int iVar1;
  QStyle *pQVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  QProxyStylePrivate *in_RDI;
  undefined8 in_R8;
  QProxyStylePrivate *d;
  
  d_func((QProxyStyle *)0x40941a);
  QProxyStylePrivate::ensureBaseStyle(in_RDI);
  pQVar2 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x40943a);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,in_ESI,in_RDX,in_RCX,in_R8);
  return iVar1;
}

Assistant:

int QProxyStyle::styleHint(StyleHint hint, const QStyleOption *option, const QWidget *widget, QStyleHintReturn *returnData) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->styleHint(hint, option, widget, returnData);
}